

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase710::run(TestCase710 *this)

{
  long *plVar1;
  undefined8 *puVar2;
  AsyncInputStream AVar3;
  PromiseBase PVar4;
  size_t sVar5;
  __pid_t _Var6;
  undefined4 extraout_var;
  size_t sVar7;
  _func_int **extraout_RDX;
  long lVar8;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  Fault f;
  CapabilityPipe pipe3;
  AsyncIoContext ioContext;
  CapabilityPipe pipe2;
  Own<kj::AsyncCapabilityStream,_std::nullptr_t> receiveStreams [3];
  ReadResult result;
  CapabilityPipe pipe;
  char receiveBuffer [7];
  Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_> result_1;
  ArrayPtr<const_unsigned_char> secondBuf;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  AsyncInputStream local_270;
  undefined1 local_268 [40];
  bool local_240;
  bool local_238;
  PromiseBase local_228;
  size_t sStack_220;
  ArrayDisposer *pAStack_218;
  DebugExpression<kj::String> local_208;
  long local_1e8 [2];
  undefined8 *local_1d8;
  long *local_1d0;
  undefined8 *local_1c8;
  long *local_1c0;
  undefined8 *local_1b8;
  long *local_1b0;
  void *local_1a8;
  long local_198 [4];
  undefined8 *local_178;
  long *plStack_170;
  undefined8 local_168;
  uint64_t uStack_160;
  long local_158 [3];
  long local_140;
  PromiseArenaMember local_138;
  long *local_128 [3];
  char local_110 [8];
  long *local_108;
  undefined8 uStack_100;
  undefined8 *local_f8;
  char *local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  char *local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  char *local_b8;
  char *pcStack_b0;
  undefined8 local_a8;
  char *local_a0;
  char *pcStack_98;
  undefined8 local_90;
  char *local_88;
  char *pcStack_80;
  undefined8 local_78;
  char *local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 *local_40;
  undefined3 *local_38;
  undefined8 local_30;
  
  setupAsyncIo();
  (**(code **)(*local_1b0 + 0x10))(&local_138.arena);
  (**(code **)(*local_1b0 + 0x10))(local_198);
  (**(code **)(*local_1b0 + 0x10))(local_1e8);
  local_108 = (long *)kj::_::HeapArrayDisposer::allocateImpl
                                (0x10,0,2,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_40 = &kj::_::HeapArrayDisposer::instance;
  *local_108 = local_198[0];
  local_108[1] = local_198[1];
  local_198[1] = 0;
  local_108[2] = local_1e8[0];
  local_108[3] = local_1e8[1];
  local_1e8[1] = 0;
  local_38 = &kj::_::ByteLiteral<4ul>;
  local_30 = 3;
  uStack_100 = 2;
  local_f8 = &kj::_::HeapArrayDisposer::instance;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  (**(code **)(*local_128[0] + 0x80))
            (local_268,local_128[0],&kj::_::ByteLiteral<4ul>,3,&local_38,1,&local_108);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_68 = "run";
  local_60 = 0x3000002d2;
  uVar12 = 0x3000002d2;
  pcVar9 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcVar10 = "run";
  Promise<void>::wait((Promise<void> *)local_268,local_1a8);
  uVar13 = local_268._0_8_;
  if ((PromiseNode *)local_268._0_8_ != (PromiseNode *)0x0) {
    local_268._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar13);
  }
  uVar13 = uStack_100;
  plVar1 = local_108;
  if (local_108 != (long *)0x0) {
    local_108 = (long *)0x0;
    uStack_100 = 0;
    (**(code **)*local_f8)
              (local_f8,plVar1,0x10,uVar13,uVar13,
               ArrayDisposer::Dispose_<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>::
               destruct,pcVar9,pcVar10,uVar12);
  }
  local_110[4] = '\0';
  local_110[5] = '\0';
  local_110[6] = 0;
  local_110[0] = '\0';
  local_110[1] = '\0';
  local_110[2] = '\0';
  local_110[3] = '\0';
  local_158[0] = 0;
  local_158[1] = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = (undefined8 *)0x0;
  plStack_170 = (long *)0x0;
  (**(code **)(*local_128[2] + 0x88))(local_268,local_128[2],local_110,6,7,&local_178,3);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_80 = "run";
  local_78 = 0x11000002d7;
  _Var6 = Promise<kj::AsyncCapabilityStream::ReadResult>::wait
                    ((Promise<kj::AsyncCapabilityStream::ReadResult> *)local_268,local_1a8);
  uVar13 = local_268._0_8_;
  local_140 = CONCAT44(extraout_var,_Var6);
  local_138._vptr_PromiseArenaMember = extraout_RDX;
  if ((OwnPromiseNode)local_268._0_8_ != (OwnPromiseNode)0x0) {
    local_268._0_8_ = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar13);
  }
  local_268._0_8_ = &local_140;
  local_268._8_4_ = 6;
  local_268._16_8_ = " == ";
  local_268._24_8_ = &DAT_00000005;
  local_268[0x20] = local_140 == 6;
  if ((!local_268[0x20]) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[39],kj::_::DebugComparison<unsigned_long&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x2da,ERROR,"\"failed: expected \" \"result.byteCount == 6\", _kjCondition",
               (char (*) [39])"failed: expected result.byteCount == 6",
               (DebugComparison<unsigned_long_&,_int> *)local_268);
  }
  local_110[6] = 0;
  sVar7 = strlen(local_110);
  local_208.value.content.size_ = sVar7 + 1;
  local_208.value.content.ptr = local_110;
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[7]> *)local_268,
             (DebugExpression<kj::StringPtr> *)&local_208,(char (*) [7])0x4d937d);
  if ((local_240 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::StringPtr,char_const(&)[7]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x2dc,ERROR,
               "\"failed: expected \" \"kj::StringPtr(receiveBuffer) == \\\"foobar\\\"\", _kjCondition"
               ,(char (*) [58])"failed: expected kj::StringPtr(receiveBuffer) == \"foobar\"",
               (DebugComparison<kj::StringPtr,_const_char_(&)[7]> *)local_268);
  }
  local_268._0_8_ = &local_138;
  local_268[0x20] = local_138._vptr_PromiseArenaMember == (_func_int **)0x2;
  local_268._8_4_ = 2;
  local_268._16_8_ = " == ";
  local_268._24_8_ = &DAT_00000005;
  if (local_268[0x20]) {
    (**(code **)plStack_170[1])(local_268,plStack_170 + 1,&kj::_::ByteLiteral<4ul>,3);
    local_a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcStack_98 = "run";
    local_90 = 0x3000002e0;
    Promise<void>::wait((Promise<void> *)local_268,local_1a8);
    uVar13 = local_268._0_8_;
    if ((PromiseNode *)local_268._0_8_ != (PromiseNode *)0x0) {
      local_268._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar13);
    }
    plVar1 = plStack_170;
    if (plStack_170 != (long *)0x0) {
      plStack_170 = (long *)0x0;
      (**(code **)*local_178)(local_178,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    AsyncInputStream::readAllText(&local_270,local_198[3]);
    local_b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcStack_b0 = "run";
    local_a8 = 0x4c000002e2;
    uVar13 = 0x4c000002e2;
    pcVar10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcVar11 = "run";
    Promise<kj::String>::wait((Promise<kj::String> *)&local_228,&local_270);
    local_208.value.content.ptr = (char *)local_228.node.ptr;
    local_208.value.content.size_ = sStack_220;
    local_208.value.content.disposer = pAStack_218;
    local_228.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    sStack_220 = 0;
    kj::_::DebugExpression<kj::String>::operator==
              ((DebugComparison<kj::String,_const_char_(&)[4]> *)local_268,&local_208,
               (char (*) [4])0x4aa378);
    sVar5 = local_208.value.content.size_;
    pcVar9 = local_208.value.content.ptr;
    if ((PromiseNode *)local_208.value.content.ptr != (PromiseNode *)0x0) {
      local_208.value.content.ptr = (char *)0x0;
      local_208.value.content.size_ = 0;
      (**(local_208.value.content.disposer)->_vptr_ArrayDisposer)
                (local_208.value.content.disposer,pcVar9,1,sVar5,sVar5,0,pcVar10,pcVar11,uVar13);
    }
    sVar5 = sStack_220;
    PVar4.node.ptr = local_228.node.ptr;
    if (local_228.node.ptr != (PromiseNode *)0x0) {
      local_228.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      sStack_220 = 0;
      (**pAStack_218->_vptr_ArrayDisposer)(pAStack_218,PVar4.node.ptr,1,sVar5,sVar5,0);
    }
    AVar3._vptr_AsyncInputStream = local_270._vptr_AsyncInputStream;
    if ((PromiseArenaMember *)local_270._vptr_AsyncInputStream != (PromiseArenaMember *)0x0) {
      local_270._vptr_AsyncInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar3._vptr_AsyncInputStream);
    }
    if ((local_238 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[81],kj::_::DebugComparison<kj::String,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x2e2,ERROR,
                 "\"failed: expected \" \"pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == \\\"baz\\\"\", _kjCondition"
                 ,(char (*) [81])
                  "failed: expected pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == \"baz\""
                 ,(DebugComparison<kj::String,_const_char_(&)[4]> *)local_268);
    }
    uVar12 = local_268._8_8_;
    uVar13 = local_268._0_8_;
    if ((PromiseNode *)local_268._0_8_ != (PromiseNode *)0x0) {
      local_268._0_8_ = (PromiseArenaMember *)0x0;
      local_268._8_8_ = 0;
      (***(_func_int ***)local_268._16_8_)(local_268._16_8_,uVar13,1,uVar12,uVar12,0);
    }
    (**(code **)local_1d0[1])(local_268,local_1d0 + 1,&kj::_::ByteLiteral<4ul>,3);
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcStack_c8 = "run";
    local_c0 = 0x3000002e4;
    Promise<void>::wait((Promise<void> *)local_268,local_1a8);
    uVar13 = local_268._0_8_;
    if ((PromiseNode *)local_268._0_8_ != (PromiseNode *)0x0) {
      local_268._0_8_ = (PromiseArenaMember *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar13);
    }
    plVar1 = local_1d0;
    if (local_1d0 != (long *)0x0) {
      local_1d0 = (long *)0x0;
      (**(code **)*local_1d8)(local_1d8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    AsyncInputStream::readAllText(&local_270,uStack_160);
    local_e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcStack_e0 = "run";
    local_d8 = 0x50000002e6;
    uVar13 = 0x50000002e6;
    pcVar10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
    ;
    pcVar11 = "run";
    Promise<kj::String>::wait((Promise<kj::String> *)&local_228,&local_270);
    local_208.value.content.ptr = (char *)local_228.node.ptr;
    local_208.value.content.size_ = sStack_220;
    local_208.value.content.disposer = pAStack_218;
    local_228.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    sStack_220 = 0;
    kj::_::DebugExpression<kj::String>::operator==
              ((DebugComparison<kj::String,_const_char_(&)[4]> *)local_268,&local_208,
               (char (*) [4])0x4b3c26);
    sVar5 = local_208.value.content.size_;
    pcVar9 = local_208.value.content.ptr;
    if ((PromiseNode *)local_208.value.content.ptr != (PromiseNode *)0x0) {
      local_208.value.content.ptr = (char *)0x0;
      local_208.value.content.size_ = 0;
      (**(local_208.value.content.disposer)->_vptr_ArrayDisposer)
                (local_208.value.content.disposer,pcVar9,1,sVar5,sVar5,0,pcVar10,pcVar11,uVar13);
    }
    sVar5 = sStack_220;
    PVar4.node.ptr = local_228.node.ptr;
    if (local_228.node.ptr != (PromiseNode *)0x0) {
      local_228.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
      sStack_220 = 0;
      (**pAStack_218->_vptr_ArrayDisposer)(pAStack_218,PVar4.node.ptr,1,sVar5,sVar5,0);
    }
    AVar3._vptr_AsyncInputStream = local_270._vptr_AsyncInputStream;
    if ((PromiseArenaMember *)local_270._vptr_AsyncInputStream != (PromiseArenaMember *)0x0) {
      local_270._vptr_AsyncInputStream = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)AVar3._vptr_AsyncInputStream);
    }
    if ((local_238 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[85],kj::_::DebugComparison<kj::String,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x2e6,ERROR,
                 "\"failed: expected \" \"receiveStreams[1]->readAllText().wait(ioContext.waitScope) == \\\"qux\\\"\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected receiveStreams[1]->readAllText().wait(ioContext.waitScope) == \"qux\""
                 ,(DebugComparison<kj::String,_const_char_(&)[4]> *)local_268);
    }
    uVar12 = local_268._8_8_;
    uVar13 = local_268._0_8_;
    if ((PromiseNode *)local_268._0_8_ != (PromiseNode *)0x0) {
      local_268._0_8_ = (PromiseArenaMember *)0x0;
      local_268._8_8_ = 0;
      (***(_func_int ***)local_268._16_8_)(local_268._16_8_,uVar13,1,uVar12,uVar12,0);
    }
    lVar8 = 0;
    do {
      plVar1 = *(long **)((long)local_158 + lVar8 + 8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)local_158 + lVar8 + 8) = 0;
        (**(code **)**(undefined8 **)((long)local_158 + lVar8))
                  (*(undefined8 **)((long)local_158 + lVar8),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      lVar8 = lVar8 + -0x10;
    } while (lVar8 != -0x30);
    lVar8 = 0x10;
    do {
      plVar1 = *(long **)((long)local_1e8 + lVar8 + 8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)local_1e8 + lVar8 + 8) = 0;
        (**(code **)**(undefined8 **)((long)local_1e8 + lVar8))
                  (*(undefined8 **)((long)local_1e8 + lVar8),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      lVar8 = lVar8 + -0x10;
    } while (lVar8 != -0x10);
    lVar8 = 0x10;
    do {
      plVar1 = *(long **)((long)local_198 + lVar8 + 8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)local_198 + lVar8 + 8) = 0;
        (**(code **)**(undefined8 **)((long)local_198 + lVar8))
                  (*(undefined8 **)((long)local_198 + lVar8),
                   (long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      lVar8 = lVar8 + -0x10;
    } while (lVar8 != -0x10);
    lVar8 = 0x10;
    do {
      plVar1 = *(long **)((long)local_128 + lVar8);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)((long)local_128 + lVar8) = 0;
        puVar2 = *(undefined8 **)((long)local_128 + lVar8 + -8);
        (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
      }
      plVar1 = local_1b0;
      lVar8 = lVar8 + -0x10;
    } while (lVar8 != -0x10);
    if (local_1b0 != (long *)0x0) {
      local_1b0 = (long *)0x0;
      (**(code **)*local_1b8)(local_1b8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    plVar1 = local_1c0;
    if (local_1c0 != (long *)0x0) {
      local_1c0 = (long *)0x0;
      (**(code **)*local_1c8)(local_1c8,(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&>
            ((Fault *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,0x2de,FAILED,"result.capCount == 2","_kjCondition,",
             (DebugComparison<unsigned_long_&,_int> *)local_268);
  kj::_::Debug::Fault::fatal((Fault *)&local_208);
}

Assistant:

TEST(AsyncIo, CapabilityPipeMultiStreamMessage) {
  auto ioContext = setupAsyncIo();

  auto pipe = ioContext.provider->newCapabilityPipe();
  auto pipe2 = ioContext.provider->newCapabilityPipe();
  auto pipe3 = ioContext.provider->newCapabilityPipe();

  auto streams = heapArrayBuilder<Own<AsyncCapabilityStream>>(2);
  streams.add(kj::mv(pipe2.ends[0]));
  streams.add(kj::mv(pipe3.ends[0]));

  ArrayPtr<const byte> secondBuf = "bar"_kjb;
  pipe.ends[0]->writeWithStreams("foo"_kjb, arrayPtr(&secondBuf, 1), streams.finish())
      .wait(ioContext.waitScope);

  char receiveBuffer[7]{};
  Own<AsyncCapabilityStream> receiveStreams[3];
  auto result = pipe.ends[1]->tryReadWithStreams(receiveBuffer, 6, 7, receiveStreams, 3)
      .wait(ioContext.waitScope);

  KJ_EXPECT(result.byteCount == 6);
  receiveBuffer[6] = '\0';
  KJ_EXPECT(kj::StringPtr(receiveBuffer) == "foobar");

  KJ_ASSERT(result.capCount == 2);

  receiveStreams[0]->write("baz"_kjb).wait(ioContext.waitScope);
  receiveStreams[0] = nullptr;
  KJ_EXPECT(pipe2.ends[1]->readAllText().wait(ioContext.waitScope) == "baz");

  pipe3.ends[1]->write("qux"_kjb).wait(ioContext.waitScope);
  pipe3.ends[1] = nullptr;
  KJ_EXPECT(receiveStreams[1]->readAllText().wait(ioContext.waitScope) == "qux");
}